

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall
wabt::WastParser::ParseMemoryBinaryExpr<wabt::MemoryBinaryExpr<(wabt::ExprType)28>>
          (WastParser *this,Location loc,
          unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  Result RVar2;
  Expr *pEVar3;
  Enum EVar4;
  Var srcmemidx;
  Var destmemidx;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_108);
  Var::Var(&local_150);
  RVar2 = ParseMemidx(this,loc,&local_108);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    RVar2 = ParseMemidx(this,loc,&local_150);
    if (RVar2.enum_ != Error) {
      pEVar3 = (Expr *)operator_new(0xd0);
      Var::Var(&local_78,&local_108);
      Var::Var(&local_c0,&local_150);
      (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar3->loc).filename._M_len = loc.filename._M_len;
      (pEVar3->loc).filename._M_str = loc.filename._M_str;
      (pEVar3->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
      *(undefined8 *)((long)&(pEVar3->loc).field_1 + 8) = loc.field_1._8_8_;
      pEVar3->type_ = MemoryCopy;
      pEVar3->_vptr_Expr = (_func_int **)&PTR__MemoryBinaryExpr_001a1538;
      Var::Var((Var *)(pEVar3 + 1),&local_78);
      Var::Var((Var *)&pEVar3[2].super_intrusive_list_base<wabt::Expr>,&local_c0);
      pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar3;
      if (pEVar1 != (Expr *)0x0) {
        (*pEVar1->_vptr_Expr[1])();
      }
      Var::~Var(&local_c0);
      Var::~Var(&local_78);
      EVar4 = Ok;
    }
  }
  Var::~Var(&local_150);
  Var::~Var(&local_108);
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseMemoryBinaryExpr(Location loc,
                                         std::unique_ptr<Expr>* out_expr) {
  Var destmemidx;
  Var srcmemidx;
  CHECK_RESULT(ParseMemidx(loc, &destmemidx));
  CHECK_RESULT(ParseMemidx(loc, &srcmemidx));
  out_expr->reset(new T(destmemidx, srcmemidx, loc));
  return Result::Ok;
}